

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22460c::BNTest_LessThanWords_Test::TestBody(BNTest_LessThanWords_Test *this)

{
  bool bVar1;
  char *pcVar2;
  bool local_119;
  AssertHelper local_108;
  Message local_100;
  int local_f8 [2];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  int local_d0 [2];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  int local_a8;
  uint local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  ulong uStack_88;
  ScopedTrace gtest_trace_2505;
  size_t k;
  Message local_78;
  int local_70;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ScopedTrace local_41;
  ulong uStack_40;
  ScopedTrace gtest_trace_2500;
  size_t j;
  ulong uStack_30;
  ScopedTrace gtest_trace_2498;
  size_t i_1;
  size_t i;
  ulong uStack_18;
  int is_word;
  size_t one_word;
  BNTest_LessThanWords_Test *this_local;
  
  for (uStack_18 = 0; uStack_18 < 0x18; uStack_18 = uStack_18 + 1) {
    bVar1 = true;
    for (i_1 = 1; i_1 < 4; i_1 = i_1 + 1) {
      if (TestBody::kTestVectors[uStack_18][i_1] != 0) {
        bVar1 = false;
        break;
      }
    }
    if (!bVar1) break;
  }
  for (uStack_30 = 0; uStack_30 < 0x18; uStack_30 = uStack_30 + 1) {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)((long)&j + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9c2,&stack0xffffffffffffffd0);
    for (uStack_40 = 0; uStack_40 < 0x18; uStack_40 = uStack_40 + 1) {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_41,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x9c4,&stack0xffffffffffffffc0);
      local_6c = (uint)(uStack_30 < uStack_40);
      local_70 = bn_less_than_words(TestBody::kTestVectors[uStack_30],
                                    TestBody::kTestVectors[uStack_40],4);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_68,"i < j ? 1 : 0",
                 "bn_less_than_words(kTestVectors[i], kTestVectors[j], (sizeof(kTestVectors[i]) / sizeof((kTestVectors[i])[0])))"
                 ,(int *)&local_6c,&local_70);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&k,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x9c7,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&k,&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&k);
        testing::Message::~Message(&local_78);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
      for (uStack_88 = 0; uStack_88 < uStack_18; uStack_88 = uStack_88 + 1) {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  ((ScopedTrace *)
                   ((long)&gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x9c9,&stack0xffffffffffffff78);
        local_119 = uStack_88 <= uStack_30 && uStack_30 < uStack_40;
        local_a4 = (uint)local_119;
        local_a8 = bn_in_range_words(TestBody::kTestVectors[uStack_30],
                                     TestBody::kTestVectors[uStack_88][0],
                                     TestBody::kTestVectors[uStack_40],4);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_a0,"k <= i && i < j ? 1 : 0",
                   "bn_in_range_words(kTestVectors[i], kTestVectors[k][0], kTestVectors[j], (sizeof(kTestVectors[i]) / sizeof((kTestVectors[i])[0])))"
                   ,(int *)&local_a4,&local_a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
        if (!bVar1) {
          testing::Message::Message(&local_b0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x9cd,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
      }
      testing::ScopedTrace::~ScopedTrace(&local_41);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&j + 7));
  }
  local_d0[1] = 0;
  local_d0[0] = bn_less_than_words((BN_ULONG *)0x0,(BN_ULONG *)0x0,0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c8,"0","bn_less_than_words(__null, __null, 0)",local_d0 + 1,local_d0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f8[1] = 0;
  local_f8[0] = bn_in_range_words((BN_ULONG *)0x0,0,(BN_ULONG *)0x0,0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f0,"0","bn_in_range_words(__null, 0, __null, 0)",local_f8 + 1,
             local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9d3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  return;
}

Assistant:

TEST_F(BNTest, LessThanWords) {
  // kTestVectors is an array of 256-bit values in sorted order.
  static const BN_ULONG kTestVectors[][256 / BN_BITS2] = {
      {TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0x00000001), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0x00000002), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0x0000ffff), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0x83339914), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0xfffffffe), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0xffffffff), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0xed17ac85, 0x83339914), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0xffffffff, 0xffffffff), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0x83339914), TOBN(0x00000000, 0x00000001),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff),
       TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000)},
      {TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff),
       TOBN(0xffffffff, 0xffffffff), TOBN(0x00000000, 0x00000000)},
      {TOBN(0x00000000, 0x00000000), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0x00000000, 0x83339915), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0xed17ac85, 0x00000000), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0xed17ac85, 0x83339915), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0xed17ac85, 0xffffffff), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0xffffffff, 0x83339915), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0xffffffff, 0xffffffff), TOBN(0x1d6f60ba, 0x893ba84c),
       TOBN(0x597d89b3, 0x754abe9f), TOBN(0xb504f333, 0xf9de6484)},
      {TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000),
       TOBN(0x00000000, 0x00000000), TOBN(0xffffffff, 0xffffffff)},
      {TOBN(0x00000000, 0x00000000), TOBN(0x00000000, 0x00000000),
       TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff)},
      {TOBN(0x00000000, 0x00000001), TOBN(0x00000000, 0x00000000),
       TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff)},
      {TOBN(0x00000000, 0x00000000), TOBN(0xffffffff, 0xffffffff),
       TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff)},
      {TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff),
       TOBN(0xffffffff, 0xffffffff), TOBN(0xffffffff, 0xffffffff)},
  };

  // Determine where the single-word values stop.
  size_t one_word;
  for (one_word = 0; one_word < OPENSSL_ARRAY_SIZE(kTestVectors); one_word++) {
    int is_word = 1;
    for (size_t i = 1; i < OPENSSL_ARRAY_SIZE(kTestVectors[one_word]); i++) {
      if (kTestVectors[one_word][i] != 0) {
        is_word = 0;
        break;
      }
    }
    if (!is_word) {
      break;
    }
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTestVectors); i++) {
    SCOPED_TRACE(i);
    for (size_t j = 0; j < OPENSSL_ARRAY_SIZE(kTestVectors); j++) {
      SCOPED_TRACE(j);
      EXPECT_EQ(i < j ? 1 : 0,
                bn_less_than_words(kTestVectors[i], kTestVectors[j],
                                   OPENSSL_ARRAY_SIZE(kTestVectors[i])));
      for (size_t k = 0; k < one_word; k++) {
        SCOPED_TRACE(k);
        EXPECT_EQ(k <= i && i < j ? 1 : 0,
                  bn_in_range_words(kTestVectors[i], kTestVectors[k][0],
                                    kTestVectors[j],
                                    OPENSSL_ARRAY_SIZE(kTestVectors[i])));
      }
    }
  }

  EXPECT_EQ(0, bn_less_than_words(NULL, NULL, 0));
  EXPECT_EQ(0, bn_in_range_words(NULL, 0, NULL, 0));
}